

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxIn
          (ConfidentialTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  wally_tx *tx;
  pointer pCVar1;
  pointer pCVar2;
  Txid *txid_00;
  bool bVar3;
  CfdException *pCVar4;
  uint index_00;
  int ret;
  Txid *local_350;
  size_t is_coinbase;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_340;
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_308;
  ConfidentialTxIn txin;
  ConfidentialTxIn local_190;
  
  if ((long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x15ffffffea0) {
    txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4b5368;
    txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x5ee;
    txin.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "AddTxIn";
    logger::warn<>((CfdSourceLocation *)&txin,"vin maximum.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&txin,"txin maximum.",(allocator *)&local_190);
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&txin);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_350 = txid;
  Txid::GetData((ByteData *)&txin,txid);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_308,
                     (ByteData *)&txin);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txin);
  empty_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = Script::IsEmpty(unlocking_script);
  if (bVar3) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_340,&empty_data);
  }
  else {
    Script::GetData((ByteData *)&txin,unlocking_script);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_340,
                       (ByteData *)&txin);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txin);
  }
  ret = wally_tx_add_elements_raw_input
                  (tx,local_308._M_impl.super__Vector_impl_data._M_start,
                   (long)local_308._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_308._M_impl.super__Vector_impl_data._M_start,index,sequence,
                   local_340._M_impl.super__Vector_impl_data._M_start,
                   (long)local_340._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_340._M_impl.super__Vector_impl_data._M_start,
                   (wally_tx_witness_stack *)0x0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                   (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,0);
  if (ret == 0) {
    is_coinbase = 0;
    wally_tx_is_coinbase(tx,&is_coinbase);
    txid_00 = local_350;
    index_00 = index & 0x3fffffff;
    if (is_coinbase != 0) {
      index_00 = index;
    }
    ConfidentialTxIn::ConfidentialTxIn(&txin,local_350,index_00,sequence);
    bVar3 = Script::IsEmpty(unlocking_script);
    if (!bVar3) {
      ConfidentialTxIn::ConfidentialTxIn(&local_190,txid_00,index_00,sequence,unlocking_script);
      ConfidentialTxIn::operator=(&txin,&local_190);
      ConfidentialTxIn::~ConfidentialTxIn(&local_190);
    }
    ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
    push_back(&this->vin_,&txin);
    pCVar1 = (this->vin_).
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar2 = (this->vin_).
             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ConfidentialTxIn::~ConfidentialTxIn(&txin);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_340);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&empty_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_308);
    return (int)(((long)pCVar1 - (long)pCVar2) / 0x160) - 1;
  }
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x4b5368;
  txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x5fe;
  txin.super_AbstractTxIn.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "AddTxIn";
  logger::warn<int&>((CfdSourceLocation *)&txin,"wally_tx_add_elements_raw_input NG[{}].",&ret);
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&txin,"txin add error.",(allocator *)&local_190);
  CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&txin);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t ConfidentialTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  std::vector<uint8_t> empty_data;
  const std::vector<uint8_t> &script_data =
      (unlocking_script.IsEmpty()) ? empty_data
                                   : unlocking_script.GetData().GetBytes();
  int ret = wally_tx_add_elements_raw_input(
      tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
      script_data.data(), script_data.size(), NULL, NULL, 0, NULL, 0, NULL, 0,
      NULL, 0, NULL, 0, NULL, 0, NULL, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }

  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);
  uint32_t set_index = (is_coinbase == 0) ? index & kTxInVoutMask : index;
  ConfidentialTxIn txin(txid, set_index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = ConfidentialTxIn(txid, set_index, sequence, unlocking_script);
  }
  vin_.push_back(txin);
  return static_cast<uint32_t>(vin_.size() - 1);
}